

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

bool dxil_spv::emit_barrier(Impl *impl,uint32_t memory_flags,uint32_t semantic_flags)

{
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Op op_00;
  uint u;
  bool bVar2;
  uint local_38;
  uint32_t semantics;
  bool needs_device_memory_scope;
  Operation *op;
  bool is_sync;
  Builder *builder;
  uint32_t semantic_flags_local;
  uint32_t memory_flags_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  bVar2 = (semantic_flags & 1) != 0;
  op_00 = OpMemoryBarrier;
  if (bVar2) {
    op_00 = OpControlBarrier;
  }
  this_00 = Converter::Impl::allocate(impl,op_00);
  if (bVar2) {
    IVar1 = spv::Builder::makeUintConstant(this,2,false);
    Operation::add_id(this_00,IVar1);
  }
  u = 2;
  if ((semantic_flags & 4) != 0) {
    u = 1;
  }
  IVar1 = spv::Builder::makeUintConstant(this,u,false);
  Operation::add_id(this_00,IVar1);
  local_38 = 8;
  if ((semantic_flags & 0xd) != 0) {
    local_38 = 0x48;
  }
  if ((semantic_flags & 1) != 0) {
    local_38 = local_38 | 0x800;
  }
  if ((semantic_flags & 2) != 0) {
    local_38 = local_38 | 0x100;
  }
  IVar1 = spv::Builder::makeUintConstant(this,local_38,false);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  return true;
}

Assistant:

static bool emit_barrier(Converter::Impl &impl, uint32_t memory_flags, uint32_t semantic_flags)
{
	auto &builder = impl.builder();
	bool is_sync = (semantic_flags & DXIL::GroupSyncBit) != 0;
	auto *op = impl.allocate(is_sync ? spv::OpControlBarrier : spv::OpMemoryBarrier);
	if (is_sync)
		op->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));

	bool needs_device_memory_scope = false;
	if ((semantic_flags & DXIL::DeviceScopeBit) != 0)
		needs_device_memory_scope = true;

	op->add_id(builder.makeUintConstant(needs_device_memory_scope ? spv::ScopeDevice : spv::ScopeWorkgroup));

	uint32_t semantics = spv::MemorySemanticsAcquireReleaseMask;
	if ((semantic_flags & (DXIL::MemoryTypeNodeInputBit | DXIL::MemoryTypeNodeOutputBit | DXIL::MemoryTypeUavBit)) != 0)
		semantics |= spv::MemorySemanticsUniformMemoryMask;
	if ((semantic_flags & DXIL::MemoryTypeUavBit) != 0)
		semantics |= spv::MemorySemanticsImageMemoryMask;
	if ((semantic_flags & DXIL::MemoryTypeGroupSharedBit) != 0)
		semantics |= spv::MemorySemanticsWorkgroupMemoryMask;

	op->add_id(builder.makeUintConstant(semantics));
	impl.add(op);

	return true;
}